

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

void __thiscall
icu_63::ChineseCalendar::offsetMonth
          (ChineseCalendar *this,int32_t newMoon,int32_t dom,int32_t delta)

{
  UBool UVar1;
  int value;
  UErrorCode UVar2;
  UErrorCode local_20;
  int32_t jd;
  UErrorCode status;
  int32_t delta_local;
  int32_t dom_local;
  int32_t newMoon_local;
  ChineseCalendar *this_local;
  
  local_20 = U_ZERO_ERROR;
  delta_local = (int)(((double)delta - 0.5) * 29.530588853) + newMoon;
  jd = delta;
  status = dom;
  _dom_local = this;
  delta_local = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                          ((double)delta_local,this,1);
  value = delta_local + 0x253d8b + status;
  if (status < U_NO_WRITE_PERMISSION) {
    Calendar::set(&this->super_Calendar,UCAL_JULIAN_DAY,value);
  }
  else {
    Calendar::set(&this->super_Calendar,UCAL_JULIAN_DAY,value + -1);
    Calendar::complete(&this->super_Calendar,&local_20);
    UVar1 = ::U_FAILURE(local_20);
    if (((UVar1 == '\0') &&
        (UVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x16])(this,5,&local_20),
        status <= UVar2)) && (UVar1 = ::U_FAILURE(local_20), UVar1 == '\0')) {
      Calendar::set(&this->super_Calendar,UCAL_JULIAN_DAY,value);
    }
  }
  return;
}

Assistant:

void ChineseCalendar::offsetMonth(int32_t newMoon, int32_t dom, int32_t delta) {
    UErrorCode status = U_ZERO_ERROR;

    // Move to the middle of the month before our target month.
    newMoon += (int32_t) (CalendarAstronomer::SYNODIC_MONTH * (delta - 0.5));

    // Search forward to the target month's new moon
    newMoon = newMoonNear(newMoon, TRUE);

    // Find the target dom
    int32_t jd = newMoon + kEpochStartAsJulianDay - 1 + dom;

    // Pin the dom.  In this calendar all months are 29 or 30 days
    // so pinning just means handling dom 30.
    if (dom > 29) {
        set(UCAL_JULIAN_DAY, jd-1);
        // TODO Fix this.  We really shouldn't ever have to
        // explicitly call complete().  This is either a bug in
        // this method, in ChineseCalendar, or in
        // Calendar.getActualMaximum().  I suspect the last.
        complete(status);
        if (U_FAILURE(status)) return;
        if (getActualMaximum(UCAL_DAY_OF_MONTH, status) >= dom) {
            if (U_FAILURE(status)) return;
            set(UCAL_JULIAN_DAY, jd);
        }
    } else {
        set(UCAL_JULIAN_DAY, jd);
    }
}